

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

void Direct_Move(TT_ExecContext exc,TT_GlyphZone zone,FT_UShort point,FT_F26Dot6 distance)

{
  int iVar1;
  long lVar2;
  FT_Long FVar3;
  long lVar4;
  
  lVar4 = (long)(exc->GS).freeVector.x;
  if (lVar4 != 0) {
    iVar1 = *(int *)&(exc->face->root).driver[2].root.library;
    if ((iVar1 == 0x23) || ((iVar1 == 0x28 && (exc->backward_compatibility == '\0')))) {
      lVar2 = zone->cur[point].x;
      FVar3 = FT_MulDiv(distance,lVar4,exc->F_dot_P);
      zone->cur[point].x = FVar3 + lVar2;
    }
    zone->tags[point] = zone->tags[point] | 8;
  }
  lVar4 = (long)(exc->GS).freeVector.y;
  if (lVar4 != 0) {
    if ((((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
         (exc->backward_compatibility == '\0')) || (exc->iupx_called == '\0')) ||
       (exc->iupy_called == '\0')) {
      lVar2 = zone->cur[point].y;
      FVar3 = FT_MulDiv(distance,lVar4,exc->F_dot_P);
      zone->cur[point].y = FVar3 + lVar2;
    }
    zone->tags[point] = zone->tags[point] | 0x10;
  }
  return;
}

Assistant:

static void
  Direct_Move( TT_ExecContext  exc,
               TT_GlyphZone    zone,
               FT_UShort       point,
               FT_F26Dot6      distance )
  {
    FT_F26Dot6  v;


    v = exc->GS.freeVector.x;

    if ( v != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY                            &&
           ( !exc->ignore_x_mode                                ||
             ( exc->sph_tweak_flags & SPH_TWEAK_ALLOW_X_DMOVE ) ) )
        zone->cur[point].x = ADD_LONG( zone->cur[point].x,
                                       FT_MulDiv( distance,
                                                  v,
                                                  exc->F_dot_P ) );
      else
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      /* Exception to the post-IUP curfew: Allow the x component of */
      /* diagonal moves, but only post-IUP.  DejaVu tries to adjust */
      /* diagonal stems like on `Z' and `z' post-IUP.               */
      if ( SUBPIXEL_HINTING_MINIMAL && !exc->backward_compatibility )
        zone->cur[point].x = ADD_LONG( zone->cur[point].x,
                                       FT_MulDiv( distance,
                                                  v,
                                                  exc->F_dot_P ) );
      else
#endif

      if ( NO_SUBPIXEL_HINTING )
        zone->cur[point].x = ADD_LONG( zone->cur[point].x,
                                       FT_MulDiv( distance,
                                                  v,
                                                  exc->F_dot_P ) );

      zone->tags[point] |= FT_CURVE_TAG_TOUCH_X;
    }

    v = exc->GS.freeVector.y;

    if ( v != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( !( SUBPIXEL_HINTING_MINIMAL    &&
              exc->backward_compatibility &&
              exc->iupx_called            &&
              exc->iupy_called            ) )
#endif
        zone->cur[point].y = ADD_LONG( zone->cur[point].y,
                                       FT_MulDiv( distance,
                                                  v,
                                                  exc->F_dot_P ) );

      zone->tags[point] |= FT_CURVE_TAG_TOUCH_Y;
    }
  }